

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O3

void __thiscall ASDCP::MXF::Track::Track(Track *this,Dictionary *d)

{
  Dictionary *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  GenericTrack *pGVar3;
  UUID *pUVar4;
  MDDEntry *pMVar5;
  
  InterchangeObject::InterchangeObject((InterchangeObject *)this,d);
  (this->super_GenericTrack).TrackID = 0;
  (this->super_GenericTrack).TrackNumber = 0;
  (this->super_GenericTrack).TrackName.m_property.super_string._M_dataplus._M_p =
       (pointer)&(this->super_GenericTrack).TrackName.m_property.super_string.field_2;
  (this->super_GenericTrack).TrackName.m_property.super_string._M_string_length = 0;
  (this->super_GenericTrack).TrackName.m_property.super_string.field_2._M_local_buf[0] = '\0';
  (this->super_GenericTrack).TrackName.m_property.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__UTF16String_00221c70;
  (this->super_GenericTrack).TrackName.m_has_value = false;
  pGVar3 = &this->super_GenericTrack;
  (pGVar3->Sequence).m_property.super_Identifier<16U>.m_HasValue = false;
  (pGVar3->Sequence).m_property.super_Identifier<16U>.m_Value[0] = '\0';
  (pGVar3->Sequence).m_property.super_Identifier<16U>.m_Value[1] = '\0';
  (pGVar3->Sequence).m_property.super_Identifier<16U>.m_Value[2] = '\0';
  (pGVar3->Sequence).m_property.super_Identifier<16U>.m_Value[3] = '\0';
  (pGVar3->Sequence).m_property.super_Identifier<16U>.m_Value[4] = '\0';
  (pGVar3->Sequence).m_property.super_Identifier<16U>.m_Value[5] = '\0';
  (pGVar3->Sequence).m_property.super_Identifier<16U>.m_Value[6] = '\0';
  pUVar4 = &(this->super_GenericTrack).Sequence.m_property;
  (pUVar4->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar4->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar4->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar4->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar4->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar4->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar4->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar4->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->super_GenericTrack).Sequence.m_property.super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->super_GenericTrack).Sequence.m_property.super_Identifier<16U>.super_IArchive._vptr_IArchive
       = (_func_int **)&PTR__IArchive_00222020;
  (this->super_GenericTrack).Sequence.m_has_value = false;
  (this->super_GenericTrack).super_InterchangeObject.super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__Track_002233b0;
  (this->EditRate).super_Rational.Numerator = 0;
  (this->EditRate).super_Rational.Denominator = 0;
  this->Origin = 0;
  (this->EditRate).super_IArchive._vptr_IArchive = (_func_int **)&PTR__IArchive_00222760;
  this_00 = (this->super_GenericTrack).super_InterchangeObject.m_Dict;
  if (this_00 != (Dictionary *)0x0) {
    pMVar5 = Dictionary::Type(this_00,MDD_Track);
    uVar1 = *(undefined8 *)pMVar5->ul;
    uVar2 = *(undefined8 *)(pMVar5->ul + 8);
    (this->super_GenericTrack).super_InterchangeObject.super_KLVPacket.m_UL.super_Identifier<16U>.
    m_HasValue = true;
    *(undefined8 *)
     (this->super_GenericTrack).super_InterchangeObject.super_KLVPacket.m_UL.super_Identifier<16U>.
     m_Value = uVar1;
    *(undefined8 *)
     ((this->super_GenericTrack).super_InterchangeObject.super_KLVPacket.m_UL.super_Identifier<16U>.
      m_Value + 8) = uVar2;
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x370,"ASDCP::MXF::Track::Track(const Dictionary *)");
}

Assistant:

Track::Track(const Dictionary* d) : GenericTrack(d), Origin(0)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_Track);
}